

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcEdgeCurve::IfcEdgeCurve(IfcEdgeCurve *this)

{
  IfcEdgeCurve *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x78,"IfcEdgeCurve");
  IfcEdge::IfcEdge(&this->super_IfcEdge,&PTR_construction_vtable_24__00f5d4b8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcEdgeCurve,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcEdgeCurve,_2UL> *)
             &(this->super_IfcEdge).field_0x40,&PTR_construction_vtable_24__00f5d530);
  (this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xf5d400;
  *(undefined8 *)&this->field_0x78 = 0xf5d4a0;
  *(undefined8 *)
   &(this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xf5d428;
  *(undefined8 *)
   &(this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xf5d450;
  *(undefined8 *)&(this->super_IfcEdge).field_0x40 = 0xf5d478;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcCurve> *)&(this->super_IfcEdge).field_0x50,
             (LazyObject *)0x0);
  std::__cxx11::string::string((string *)&this->SameSense);
  return;
}

Assistant:

IfcEdgeCurve() : Object("IfcEdgeCurve") {}